

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_step(sqlite3_stmt *pStmt)

{
  sqlite3_stmt *pz;
  sqlite3 *db;
  undefined8 *puVar1;
  sqlite3 *psVar2;
  Btree *p_00;
  Wal *pWVar3;
  undefined8 *puVar4;
  Vdbe *pVVar5;
  Vdbe *pVVar6;
  Vdbe *pVVar7;
  Vdbe *pFromStmt;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uchar *z;
  char *pcVar13;
  long *plVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined4 uVar17;
  long lVar18;
  char *pcVar19;
  int rc;
  u32 uVar20;
  Mem *pMem;
  int iVar21;
  int iVar22;
  char *pcVar23;
  ulong uVar24;
  byte *pbVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long *plVar29;
  long lVar30;
  int i;
  long lVar31;
  Vdbe *p;
  Mem *local_1a8;
  uint local_19c;
  Vdbe *local_178;
  long local_170;
  byte *local_168;
  sqlite3_stmt *local_160;
  long local_158 [37];
  
  iVar9 = vdbeSafetyNotNull((Vdbe *)pStmt);
  if (iVar9 == 0) {
    db = *(sqlite3 **)pStmt;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    pStmt[0x8d] = (sqlite3_stmt)((byte)pStmt[0x8d] & 0xfd);
    local_160 = pStmt + 0xb8;
    pz = pStmt + 0x48;
    iVar9 = 0;
LAB_00111962:
    if (*(int *)(pStmt + 0x44) != -0x420df25d) {
      sqlite3_reset(pStmt);
    }
    puVar1 = *(undefined8 **)pStmt;
    local_19c = 7;
    if (*(char *)((long)puVar1 + 0x51) != '\0') goto LAB_001123e5;
    uVar8 = *(ushort *)(pStmt + 0x8c);
    if (*(int *)(pStmt + 0x80) < 1) {
      uVar17 = 0x11;
      local_19c = 1;
      if ((uVar8 & 8) == 0) {
        if (*(int *)(pStmt + 0x80) < 0) {
          iVar11 = *(int *)((long)puVar1 + 0xa4);
          if (iVar11 == 0) {
            *(undefined4 *)(puVar1 + 0x29) = 0;
          }
          if ((puVar1[0x1b] != 0) && (*(char *)((long)puVar1 + 0xa1) == '\0')) {
            sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar1,(sqlite3_int64 *)local_160);
            iVar11 = *(int *)((long)puVar1 + 0xa4);
          }
          *(int *)((long)puVar1 + 0xa4) = iVar11 + 1;
          uVar8 = *(ushort *)(pStmt + 0x8c);
          if ((uVar8 & 0x40) == 0) {
            *(int *)((long)puVar1 + 0xac) = *(int *)((long)puVar1 + 0xac) + 1;
            uVar8 = *(ushort *)(pStmt + 0x8c);
          }
          if ((char)uVar8 < '\0') {
            *(int *)(puVar1 + 0x15) = *(int *)(puVar1 + 0x15) + 1;
            uVar8 = *(ushort *)(pStmt + 0x8c);
          }
          *(undefined4 *)(pStmt + 0x80) = 0;
        }
        goto LAB_0011199c;
      }
      goto LAB_00111e5e;
    }
LAB_0011199c:
    if ((uVar8 & 3) == 0) {
      *(int *)(puVar1 + 0x16) = *(int *)(puVar1 + 0x16) + 1;
      uVar10 = sqlite3VdbeExec((Vdbe *)pStmt);
      *(int *)(puVar1 + 0x16) = *(int *)(puVar1 + 0x16) + -1;
      local_19c = 100;
      if (uVar10 != 100) goto LAB_00111d3e;
      goto LAB_00111e41;
    }
    psVar2 = *(sqlite3 **)pStmt;
    lVar30 = *(long *)(pStmt + 0x10);
    local_1a8 = (Mem *)(lVar30 + 0x38);
    releaseMemArray(local_1a8,8);
    *(undefined8 *)(pStmt + 0x28) = 0;
    if (*(int *)(pStmt + 0x84) == 7) {
      psVar2->mallocFailed = '\x01';
      uVar10 = 1;
      goto LAB_00111d3e;
    }
    iVar11 = *(int *)(pStmt + 0x3c);
    uVar8 = *(ushort *)(pStmt + 0x8c) & 3;
    iVar22 = iVar11;
    if (uVar8 == 1) {
      lVar31 = *(long *)(pStmt + 0x10);
      if ((*(byte *)(lVar31 + 0x200) & 0x10) == 0) {
        plVar29 = (long *)0x0;
        uVar15 = 0;
      }
      else {
        uVar15 = (ulong)(uint)(*(int *)(lVar31 + 0x204) >> 3);
        plVar29 = *(long **)(lVar31 + 0x208);
      }
      pMem = (Mem *)(lVar31 + 0x1f8);
      uVar12 = 0;
      if (0 < (int)uVar15) {
        uVar12 = uVar15;
      }
      for (uVar24 = 0; uVar12 != uVar24; uVar24 = uVar24 + 1) {
        iVar22 = iVar22 + *(int *)(plVar29[uVar24] + 8);
      }
    }
    else {
      plVar29 = (long *)0x0;
      pMem = (Mem *)0x0;
      uVar15 = 0;
    }
    iVar28 = *(int *)(pStmt + 0x80);
    lVar31 = (long)iVar28;
    iVar21 = iVar28;
    if (lVar31 < iVar22) {
      iVar21 = iVar22;
    }
    lVar27 = lVar31 * 0x18;
    lVar26 = lVar31;
    do {
      iVar28 = iVar28 + 1;
      if (iVar22 <= lVar26) {
        *(int *)(pStmt + 0x80) = iVar21 + 1;
        *(undefined4 *)(pStmt + 0x84) = 0;
        uVar10 = 0x65;
        goto LAB_00111d3e;
      }
      lVar18 = lVar31;
      if (uVar8 != 2) break;
      pcVar13 = (char *)(*(long *)(pStmt + 8) + lVar27);
      lVar27 = lVar27 + 0x18;
      lVar18 = lVar26;
      lVar26 = lVar26 + 1;
    } while (*pcVar13 != -99);
    iVar22 = (int)lVar18;
    *(int *)(pStmt + 0x80) = iVar28;
    if ((psVar2->u1).isInterrupted != 0) {
      *(undefined4 *)(pStmt + 0x84) = 9;
      sqlite3SetString((char **)pz,psVar2,"%s");
      uVar10 = 1;
      goto LAB_00111d3e;
    }
    iVar28 = iVar22 - iVar11;
    plVar14 = plVar29;
    if (iVar22 < iVar11) {
      pbVar25 = (byte *)((long)iVar22 * 0x18 + *(long *)(pStmt + 8));
      iVar28 = iVar22;
    }
    else {
      while( true ) {
        iVar11 = (int)((long *)*plVar14)[1];
        if (iVar28 < iVar11) break;
        plVar14 = plVar14 + 1;
        iVar28 = iVar28 - iVar11;
      }
      pbVar25 = (byte *)((long)iVar28 * 0x18 + *(long *)*plVar14);
    }
    if (uVar8 == 1) {
      *(undefined2 *)(lVar30 + 0x40) = 4;
      *(long *)(lVar30 + 0x38) = (long)iVar28;
      *(undefined2 *)(lVar30 + 0x78) = 0xa02;
      pcVar13 = *(char **)(sqlite3OpcodeName_azName + (ulong)*pbVar25 * 8);
      *(char **)(lVar30 + 0x80) = pcVar13;
      iVar11 = sqlite3Strlen30(pcVar13);
      *(int *)(lVar30 + 0x7c) = iVar11;
      *(undefined1 *)(lVar30 + 0x7a) = 1;
      local_1a8 = (Mem *)(lVar30 + 0xa8);
      if (pbVar25[1] == 0xee) {
        iVar11 = (int)uVar15;
        iVar22 = iVar11 * 8 + 8;
        uVar12 = 0;
        if (0 < iVar11) {
          uVar12 = uVar15;
        }
        for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
          if (plVar29[uVar15] == *(long *)(pbVar25 + 0x10)) {
            uVar12 = uVar15 & 0xffffffff;
            break;
          }
        }
        if (((int)uVar12 == iVar11) &&
           (iVar28 = sqlite3VdbeMemGrow(pMem,iVar22,(uint)(iVar11 != 0)), iVar28 == 0)) {
          *(undefined8 *)(pMem->z + (long)iVar11 * 8) = *(undefined8 *)(pbVar25 + 0x10);
          *(byte *)&pMem->flags = (byte)pMem->flags | 0x10;
          pMem->n = iVar22;
        }
      }
    }
    local_1a8->flags = 4;
    local_1a8->u = (MemValue)(long)*(int *)(pbVar25 + 4);
    local_1a8[1].flags = 4;
    local_1a8[1].u = (MemValue)(long)*(int *)(pbVar25 + 8);
    local_1a8[2].flags = 4;
    local_1a8[2].u = (MemValue)(long)*(int *)(pbVar25 + 0xc);
    iVar11 = sqlite3VdbeMemClearAndResize(local_1a8 + 3,0x20);
    uVar10 = 1;
    if (iVar11 != 0) goto LAB_00111d3e;
    local_1a8[3].flags = 0x202;
    pcVar13 = local_1a8[3].z;
    pcVar23 = pcVar13;
    local_168 = pbVar25;
    switch(pbVar25[1]) {
    case 0xed:
      *pcVar13 = '\0';
      break;
    case 0xee:
      pcVar19 = "program";
      goto LAB_0011208d;
    default:
      pcVar23 = *(char **)(pbVar25 + 0x10);
      if (*(char **)(pbVar25 + 0x10) == (char *)0x0) {
        *pcVar13 = '\0';
        pcVar23 = pcVar13;
      }
      break;
    case 0xf1:
      pcVar19 = "intarray";
LAB_0011208d:
      sqlite3_snprintf(0x20,pcVar13,pcVar19);
      break;
    case 0xf2:
      sqlite3_snprintf(0x20,pcVar13,"%d",(ulong)*(uint *)(pbVar25 + 0x10));
      break;
    case 0xf3:
      uVar16 = **(undefined8 **)(pbVar25 + 0x10);
      pcVar19 = "%lld";
      goto LAB_001120b1;
    case 0xf4:
      sqlite3_snprintf(0x20,pcVar13,"%.16g",(int)**(undefined8 **)(pbVar25 + 0x10));
      break;
    case 0xf6:
      uVar16 = *(undefined8 *)(*(long *)(pbVar25 + 0x10) + 0x10);
      pcVar19 = "vtab:%p";
      goto LAB_001120b1;
    case 0xf8:
      puVar4 = *(undefined8 **)(pbVar25 + 0x10);
      uVar8 = *(ushort *)(puVar4 + 1);
      if ((uVar8 & 2) == 0) {
        if ((uVar8 & 4) == 0) {
          if ((uVar8 & 8) == 0) {
            pcVar23 = "(blob)";
            if ((uVar8 & 1) != 0) {
              sqlite3_snprintf(0x20,pcVar13,"NULL");
              pcVar23 = pcVar13;
            }
          }
          else {
            sqlite3_snprintf(0x20,pcVar13,"%.16g",(int)*puVar4);
          }
        }
        else {
          sqlite3_snprintf(0x20,pcVar13,"%lld",*puVar4);
        }
      }
      else {
        pcVar23 = (char *)puVar4[2];
      }
      break;
    case 0xfa:
      lVar30 = *(long *)(pbVar25 + 0x10);
      sqlite3_snprintf(0x20,pcVar13,"k(%d",(ulong)*(ushort *)(lVar30 + 6));
      uVar10 = sqlite3Strlen30(pcVar13);
      local_170 = lVar30;
      for (uVar15 = 0; uVar12 = (ulong)uVar10, uVar15 < *(ushort *)(lVar30 + 6); uVar15 = uVar15 + 1
          ) {
        puVar4 = *(undefined8 **)(lVar30 + 0x20 + uVar15 * 8);
        pcVar19 = "nil";
        if (puVar4 != (undefined8 *)0x0) {
          pcVar19 = (char *)*puVar4;
        }
        iVar11 = sqlite3Strlen30(pcVar19);
        if (iVar11 == 6) {
          iVar22 = bcmp(pcVar19,"BINARY",6);
          iVar11 = (uint)(iVar22 != 0) * 5 + 1;
          if (iVar22 == 0) {
            pcVar19 = "B";
          }
        }
        lVar30 = local_170;
        if (0x1a < (int)(uVar10 + iVar11)) {
          builtin_strncpy(pcVar13 + uVar12,",...",4);
          break;
        }
        pcVar13[uVar12] = ',';
        if (*(char *)(*(long *)(local_170 + 0x18) + uVar15) == '\0') {
          uVar10 = (uint)(uVar12 + 1);
        }
        else {
          uVar10 = uVar10 + 2;
          pcVar13[uVar12 + 1] = '-';
        }
        memcpy(pcVar13 + uVar10,pcVar19,(ulong)(iVar11 + 1));
        uVar10 = uVar10 + iVar11;
      }
      (pcVar13 + uVar12)[0] = ')';
      (pcVar13 + uVar12)[1] = '\0';
      break;
    case 0xfb:
      sqlite3_snprintf(0x20,pcVar13,"%s(%d)",*(undefined8 *)(*(long *)(pbVar25 + 0x10) + 0x30));
      break;
    case 0xfc:
      uVar16 = **(undefined8 **)(pbVar25 + 0x10);
      pcVar19 = "(%.20s)";
LAB_001120b1:
      sqlite3_snprintf(0x20,pcVar13,pcVar19,uVar16);
    }
    if (pcVar23 == local_1a8[3].z) {
      iVar11 = sqlite3Strlen30(local_1a8[3].z);
      local_1a8[3].n = iVar11;
      local_1a8[3].enc = '\x01';
    }
    else {
      sqlite3VdbeMemSetStr(local_1a8 + 3,pcVar23,-1,'\x01',(_func_void_void_ptr *)0x0);
    }
    uVar8 = *(ushort *)(pStmt + 0x8c);
    if ((uVar8 & 3) == 1) {
      iVar11 = sqlite3VdbeMemClearAndResize(local_1a8 + 4,4);
      uVar10 = 1;
      if (iVar11 == 0) {
        local_1a8[4].flags = 0x202;
        local_1a8[4].n = 2;
        sqlite3_snprintf(3,local_1a8[4].z,"%.2x");
        local_1a8[4].enc = '\x01';
        local_1a8[5].flags = 1;
        uVar8 = *(ushort *)(pStmt + 0x8c);
        goto LAB_001121e5;
      }
LAB_00111d3e:
      local_19c = uVar10;
      if (((puVar1[0x1b] != 0) && (*(char *)((long)puVar1 + 0xa1) == '\0')) &&
         (*(long *)(pStmt + 0xe0) != 0)) {
        sqlite3OsCurrentTimeInt64((sqlite3_vfs *)*puVar1,local_158);
        (*(code *)puVar1[0x1b])
                  (puVar1[0x1c],*(undefined8 *)(pStmt + 0xe0),
                   (local_158[0] - *(long *)(pStmt + 0xb8)) * 1000000);
      }
      if (local_19c == 0x65) {
        lVar30 = 0;
        iVar11 = 0;
        for (lVar31 = 0; lVar31 < *(int *)(puVar1 + 5); lVar31 = lVar31 + 1) {
          p_00 = *(Btree **)(puVar1[4] + 8 + lVar30);
          if (p_00 != (Btree *)0x0) {
            sqlite3BtreeEnter(p_00);
            pWVar3 = p_00->pBt->pPager->pWal;
            if (pWVar3 == (Wal *)0x0) {
              uVar20 = 0;
            }
            else {
              uVar20 = pWVar3->iCallback;
              pWVar3->iCallback = 0;
            }
            sqlite3BtreeLeave(p_00);
            if ((((code *)puVar1[0x23] != (code *)0x0) && (0 < (int)uVar20)) && (iVar11 == 0)) {
              iVar11 = (*(code *)puVar1[0x23])
                                 (puVar1[0x24],puVar1,*(undefined8 *)(puVar1[4] + lVar30));
            }
          }
          lVar30 = lVar30 + 0x20;
        }
        *(int *)(pStmt + 0x84) = iVar11;
        local_19c = 1;
        if (iVar11 == 0) {
          local_19c = 0x65;
        }
      }
    }
    else {
LAB_001121e5:
      *(ushort *)(pStmt + 0x88) = (~uVar8 & 3) << 2;
      *(long *)(pStmt + 0x28) = *(long *)(pStmt + 0x10) + 0x38;
      *(undefined4 *)(pStmt + 0x84) = 0;
      local_19c = 100;
    }
LAB_00111e41:
    *(uint *)((long)puVar1 + 0x44) = local_19c;
    iVar11 = sqlite3ApiExit(*(sqlite3 **)pStmt,*(int *)(pStmt + 0x84));
    uVar17 = 7;
    if (iVar11 == 7) {
LAB_00111e5e:
      *(undefined4 *)(pStmt + 0x84) = uVar17;
    }
    if ((local_19c - 0x66 < 0xfffffffe) && ((*(ushort *)(pStmt + 0x8c) & 0x100) != 0)) {
      local_19c = sqlite3VdbeTransferError((Vdbe *)pStmt);
    }
    local_19c = local_19c & *(uint *)(puVar1 + 9);
    if (local_19c != 0x11) goto LAB_001123f2;
    if (iVar9 == 0x32) {
      local_19c = 0x11;
      goto LAB_001123f2;
    }
    if (((byte)pStmt[0x8d] & 1) == 0) {
      pcVar13 = (char *)0x0;
    }
    else {
      pcVar13 = *(char **)(pStmt + 0xe0);
    }
    iVar11 = *(int *)(pStmt + 0x80);
    psVar2 = *(sqlite3 **)pStmt;
    local_19c = sqlite3LockAndPrepare
                          (psVar2,pcVar13,-1,0,(Vdbe *)pStmt,(sqlite3_stmt **)&local_178,
                           (char **)0x0);
    pFromStmt = local_178;
    if (local_19c == 0) {
      iVar9 = iVar9 + 1;
      memcpy(local_158,local_178,0x128);
      memcpy(pFromStmt,pStmt,0x128);
      memcpy(pStmt,local_158,0x128);
      pVVar5 = *(Vdbe **)(pStmt + 0x58);
      pVVar6 = pFromStmt->pPrev;
      pVVar7 = pFromStmt->pNext;
      pFromStmt->pPrev = *(Vdbe **)(pStmt + 0x50);
      pFromStmt->pNext = pVVar5;
      *(Vdbe **)(pStmt + 0x50) = pVVar6;
      *(Vdbe **)(pStmt + 0x58) = pVVar7;
      pcVar13 = pFromStmt->zSql;
      pFromStmt->zSql = *(char **)(pStmt + 0xe0);
      *(char **)(pStmt + 0xe0) = pcVar13;
      *(ushort *)(pStmt + 0x8c) =
           (ushort)*(undefined4 *)(pStmt + 0x8c) & 0xfeff |
           *(ushort *)&pFromStmt->field_0x8c & 0x100;
      sqlite3TransferBindings((sqlite3_stmt *)pFromStmt,pStmt);
      local_178->rc = 0;
      sqlite3VdbeFinalize(local_178);
      sqlite3_reset(pStmt);
      if (-1 < iVar11) {
        pStmt[0x8d] = (sqlite3_stmt)((byte)pStmt[0x8d] | 2);
      }
      goto LAB_00111962;
    }
    if (local_19c == 7) {
      psVar2->mallocFailed = '\x01';
    }
    z = sqlite3_value_text(db->pErr);
    sqlite3DbFree(db,*(char **)pz);
    if (db->mallocFailed == '\0') {
      pcVar13 = sqlite3DbStrDup(db,(char *)z);
    }
    else {
      local_19c = 7;
      pcVar13 = (char *)0x0;
    }
    *(char **)pz = pcVar13;
LAB_001123e5:
    *(uint *)(pStmt + 0x84) = local_19c;
LAB_001123f2:
    iVar9 = sqlite3ApiExit(db,local_19c);
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  else {
    sqlite3MisuseError(0x10f20);
    iVar9 = 0x15;
  }
  return iVar9;
}

Assistant:

SQLITE_STDCALL sqlite3_step(sqlite3_stmt *pStmt){
  int rc = SQLITE_OK;      /* Result from sqlite3Step() */
  int rc2 = SQLITE_OK;     /* Result from sqlite3Reprepare() */
  Vdbe *v = (Vdbe*)pStmt;  /* the prepared statement */
  int cnt = 0;             /* Counter to prevent infinite loop of reprepares */
  sqlite3 *db;             /* The database connection */

  if( vdbeSafetyNotNull(v) ){
    return SQLITE_MISUSE_BKPT;
  }
  db = v->db;
  sqlite3_mutex_enter(db->mutex);
  v->doingRerun = 0;
  while( (rc = sqlite3Step(v))==SQLITE_SCHEMA
         && cnt++ < SQLITE_MAX_SCHEMA_RETRY ){
    int savedPc = v->pc;
    rc2 = rc = sqlite3Reprepare(v);
    if( rc!=SQLITE_OK) break;
    sqlite3_reset(pStmt);
    if( savedPc>=0 ) v->doingRerun = 1;
    assert( v->expired==0 );
  }
  if( rc2!=SQLITE_OK ){
    /* This case occurs after failing to recompile an sql statement. 
    ** The error message from the SQL compiler has already been loaded 
    ** into the database handle. This block copies the error message 
    ** from the database handle into the statement and sets the statement
    ** program counter to 0 to ensure that when the statement is 
    ** finalized or reset the parser error message is available via
    ** sqlite3_errmsg() and sqlite3_errcode().
    */
    const char *zErr = (const char *)sqlite3_value_text(db->pErr); 
    sqlite3DbFree(db, v->zErrMsg);
    if( !db->mallocFailed ){
      v->zErrMsg = sqlite3DbStrDup(db, zErr);
      v->rc = rc2;
    } else {
      v->zErrMsg = 0;
      v->rc = rc = SQLITE_NOMEM;
    }
  }
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}